

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O3

int llama_split_prefix(char *split_prefix,size_t maxlen,char *split_path,int split_no,
                      int split_count)

{
  size_t sVar1;
  long lVar2;
  uint uVar3;
  ulong __maxlen;
  uint uVar4;
  string str_split_path;
  string str_postfix;
  char postfix [32];
  long *local_98;
  int local_90;
  long local_88 [2];
  long *local_78;
  int local_70;
  long local_68 [2];
  allocator<char> local_58 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,split_path,local_58);
  snprintf((char *)local_58,0x20,"-%05d-of-%05d.gguf",(ulong)(split_no + 1),split_count);
  local_78 = local_68;
  sVar1 = strlen((char *)local_58);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,local_58,local_58 + sVar1);
  uVar4 = local_90 - local_70;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    lVar2 = std::__cxx11::string::find
                      ((char *)&local_98,(ulong)local_78,(ulong)(uVar4 & 0x7fffffff));
    if (lVar2 != -1) {
      __maxlen = (ulong)(uVar4 & 0x7fffffff) + 1;
      if (maxlen <= __maxlen) {
        __maxlen = maxlen;
      }
      snprintf(split_prefix,__maxlen,"%s",split_path);
      uVar3 = uVar4;
    }
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return uVar3;
}

Assistant:

int llama_split_prefix(char * split_prefix, size_t maxlen, const char * split_path, int split_no, int split_count) {
    std::string str_split_path(split_path);
    char postfix[32];
    snprintf(postfix, 32, "-%05d-of-%05d.gguf", split_no + 1, split_count);
    std::string str_postfix(postfix);

    // check if split_prefix ends with postfix
    int size_prefix = str_split_path.size() - str_postfix.size();
    if (size_prefix > 0 && str_split_path.find(str_postfix, size_prefix) != std::string::npos) {
        snprintf(split_prefix, std::min((size_t) size_prefix + 1, maxlen), "%s", split_path);
        return size_prefix;
    }

    return 0;
}